

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O2

void __thiscall defyx::JitCompilerX86::h_CBRANCH(JitCompilerX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  uint j;
  long lVar5;
  uint8_t uVar6;
  int iVar7;
  
  bVar1 = instr->dst;
  iVar2 = this->registerUsage[bVar1];
  puVar4 = this->code;
  iVar7 = this->codePos;
  (puVar4 + iVar7)[0] = 'I';
  (puVar4 + iVar7)[1] = 0x81;
  iVar7 = this->codePos + 2;
  this->codePos = iVar7;
  uVar6 = bVar1 - 0x40;
  this->code[iVar7] = uVar6;
  iVar7 = this->codePos;
  this->codePos = iVar7 + 1;
  bVar1 = instr->mod >> 4;
  *(uint32_t *)(this->code + (long)iVar7 + 1) = ~(0x80 << bVar1) & (0x100 << bVar1 | instr->imm32);
  iVar7 = this->codePos + 4;
  this->codePos = iVar7;
  puVar4 = this->code;
  (puVar4 + iVar7)[0] = 'I';
  (puVar4 + iVar7)[1] = 0xf7;
  iVar7 = this->codePos + 2;
  this->codePos = iVar7;
  this->code[iVar7] = uVar6;
  iVar7 = this->codePos;
  this->codePos = iVar7 + 1;
  *(int *)(this->code + (long)iVar7 + 1) = 0xff00 << bVar1;
  iVar7 = this->codePos + 4;
  this->codePos = iVar7;
  puVar4 = this->code;
  (puVar4 + iVar7)[0] = '\x0f';
  (puVar4 + iVar7)[1] = 0x84;
  iVar3 = this->codePos;
  iVar7 = iVar3 + 2;
  this->codePos = iVar7;
  *(int *)(this->code + iVar7) =
       ((this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(long)iVar2 + 1] - iVar3) + -6;
  this->codePos = this->codePos + 4;
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    this->registerUsage[lVar5] = i;
  }
  return;
}

Assistant:

void JitCompilerX86::h_CBRANCH(Instruction& instr, int i) {
		int reg = instr.dst;
		int target = registerUsage[reg] + 1;
		emit(REX_ADD_I);
		emitByte(0xc0 + reg);
		int shift = instr.getModCond() + ConditionOffset;
		uint32_t imm = instr.getImm32() | (1UL << shift);
		if (ConditionOffset > 0 || shift > 0)
			imm &= ~(1UL << (shift - 1));
		emit32(imm);
		emit(REX_TEST);
		emitByte(0xc0 + reg);
		emit32(ConditionMask << shift);
		emit(JZ);
		emit32(instructionOffsets[target] - (codePos + 4));
		//mark all registers as used
		for (unsigned j = 0; j < RegistersCount; ++j) {
			registerUsage[j] = i;
		}
	}